

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main_impl.h
# Opt level: O3

int secp256k1_ecdh(secp256k1_context *ctx,uchar *output,secp256k1_pubkey *point,uchar *scalar,
                  secp256k1_ecdh_hash_function hashfp,void *data)

{
  int iVar1;
  long lVar2;
  uint uVar3;
  int over;
  uint uVar4;
  unsigned_long _zzq_result_1;
  unsigned_long _zzq_result;
  secp256k1_ge pt;
  uchar y [32];
  uchar x [32];
  secp256k1_gej res;
  secp256k1_scalar local_1bc;
  secp256k1_ecdh_hash_function local_1b8;
  uchar *local_1b0;
  undefined8 local_1a8;
  secp256k1_ge *local_1a0;
  undefined8 local_198;
  undefined8 local_190;
  undefined8 local_188;
  undefined8 local_180;
  secp256k1_ge local_178;
  uchar local_108 [32];
  undefined8 local_e8;
  undefined8 uStack_e0;
  undefined8 local_d8;
  undefined8 uStack_d0;
  secp256k1_gej local_c8;
  
  if (ctx == (secp256k1_context *)0x0) {
    secp256k1_ecdh_cold_4();
  }
  else if (output != (uchar *)0x0) {
    if (point == (secp256k1_pubkey *)0x0) {
      secp256k1_ecdh_cold_2();
      return 0;
    }
    if (scalar == (uchar *)0x0) {
      secp256k1_ecdh_cold_1();
      return 0;
    }
    local_1b0 = output;
    secp256k1_pubkey_load(ctx,&local_178,point);
    lVar2 = 0;
    uVar4 = 0;
    uVar3 = 0;
    do {
      uVar3 = (uint)scalar[lVar2] | uVar3 << 8;
      if (0xc < uVar3) {
        uVar4 = 1;
        uVar3 = uVar3 - (uVar3 / 0xd + (uVar3 / 0xd) * 0xc);
      }
      lVar2 = lVar2 + 1;
    } while (lVar2 != 0x20);
    local_1b8 = ecdh_hash_function_sha256;
    if (hashfp != (secp256k1_ecdh_hash_function)0x0) {
      local_1b8 = hashfp;
    }
    local_1bc = uVar3;
    secp256k1_scalar_verify((secp256k1_scalar *)(ulong)uVar3);
    secp256k1_scalar_verify((secp256k1_scalar *)(ulong)uVar3);
    uVar4 = uVar4 | uVar3 == 0;
    local_e8 = CONCAT44(local_e8._4_4_,uVar4);
    local_c8.x.n[0] = 0x4d430005;
    local_c8.x.n[2] = 4;
    local_c8.x.n[3] = 0;
    local_c8.x.n[4] = 0;
    local_c8.x.magnitude = 0;
    local_c8.x.normalized = 0;
    local_1a8 = 0;
    local_1bc = uVar4 | uVar4 - 1 & local_1bc;
    local_c8.x.n[1] = (uint64_t)&local_1bc;
    secp256k1_scalar_verify((secp256k1_scalar *)(ulong)local_1bc);
    secp256k1_ecmult_const(&local_c8,&local_178,&local_1bc);
    secp256k1_ge_set_gej(&local_178,&local_c8);
    secp256k1_fe_normalize(&local_178.x);
    secp256k1_fe_normalize(&local_178.y);
    secp256k1_fe_get_b32((uchar *)&local_e8,&local_178.x);
    secp256k1_fe_get_b32(local_108,&local_178.y);
    iVar1 = (*local_1b8)(local_1b0,(uchar *)&local_e8,local_108,data);
    local_d8 = 0;
    uStack_d0 = 0;
    local_e8 = 0;
    uStack_e0 = 0;
    local_108[0x10] = '\0';
    local_108[0x11] = '\0';
    local_108[0x12] = '\0';
    local_108[0x13] = '\0';
    local_108[0x14] = '\0';
    local_108[0x15] = '\0';
    local_108[0x16] = '\0';
    local_108[0x17] = '\0';
    local_108[0x18] = '\0';
    local_108[0x19] = '\0';
    local_108[0x1a] = '\0';
    local_108[0x1b] = '\0';
    local_108[0x1c] = '\0';
    local_108[0x1d] = '\0';
    local_108[0x1e] = '\0';
    local_108[0x1f] = '\0';
    local_108[0] = '\0';
    local_108[1] = '\0';
    local_108[2] = '\0';
    local_108[3] = '\0';
    local_108[4] = '\0';
    local_108[5] = '\0';
    local_108[6] = '\0';
    local_108[7] = '\0';
    local_108[8] = '\0';
    local_108[9] = '\0';
    local_108[10] = '\0';
    local_108[0xb] = '\0';
    local_108[0xc] = '\0';
    local_108[0xd] = '\0';
    local_108[0xe] = '\0';
    local_108[0xf] = '\0';
    local_1bc = 0;
    local_178.infinity = 0;
    local_178._100_4_ = 0;
    local_178.y.n[4] = 0;
    local_178.y.magnitude = 0;
    local_178.y.normalized = 0;
    local_178.y.n[2] = 0;
    local_178.y.n[3] = 0;
    local_178.y.n[0] = 0;
    local_178.y.n[1] = 0;
    local_178.x.n[4] = 0;
    local_178.x.magnitude = 0;
    local_178.x.normalized = 0;
    local_178.x.n[2] = 0;
    local_178.x.n[3] = 0;
    local_178.x.n[0] = 0;
    local_178.x.n[1] = 0;
    local_1a0 = &local_178;
    local_1a8 = 0x4d430001;
    local_198 = 0x68;
    local_190 = 0;
    local_188 = 0;
    local_180 = 0;
    memset(&local_c8,0,0x98);
    return (uint)(iVar1 != 0 && uVar4 == 0);
  }
  secp256k1_ecdh_cold_3();
  return 0;
}

Assistant:

int secp256k1_ecdh(const secp256k1_context* ctx, unsigned char *output, const secp256k1_pubkey *point, const unsigned char *scalar, secp256k1_ecdh_hash_function hashfp, void *data) {
    int ret = 0;
    int overflow = 0;
    secp256k1_gej res;
    secp256k1_ge pt;
    secp256k1_scalar s;
    unsigned char x[32];
    unsigned char y[32];

    VERIFY_CHECK(ctx != NULL);
    ARG_CHECK(output != NULL);
    ARG_CHECK(point != NULL);
    ARG_CHECK(scalar != NULL);

    if (hashfp == NULL) {
        hashfp = secp256k1_ecdh_hash_function_default;
    }

    secp256k1_pubkey_load(ctx, &pt, point);
    secp256k1_scalar_set_b32(&s, scalar, &overflow);

    overflow |= secp256k1_scalar_is_zero(&s);
    secp256k1_scalar_cmov(&s, &secp256k1_scalar_one, overflow);

    secp256k1_ecmult_const(&res, &pt, &s);
    secp256k1_ge_set_gej(&pt, &res);

    /* Compute a hash of the point */
    secp256k1_fe_normalize(&pt.x);
    secp256k1_fe_normalize(&pt.y);
    secp256k1_fe_get_b32(x, &pt.x);
    secp256k1_fe_get_b32(y, &pt.y);

    ret = hashfp(output, x, y, data);

    secp256k1_memclear(x, sizeof(x));
    secp256k1_memclear(y, sizeof(y));
    secp256k1_scalar_clear(&s);
    secp256k1_ge_clear(&pt);
    secp256k1_gej_clear(&res);

    return !!ret & !overflow;
}